

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex.cpp
# Opt level: O0

void __thiscall
ary::KeypointTrackingLocalizer::KeypointTrackingLocalizer
          (KeypointTrackingLocalizer *this,SharedCameraModel *camera)

{
  PlaneTracker *this_00;
  Ptr<ary::PlaneTracker> local_28;
  SharedCameraModel *local_18;
  SharedCameraModel *camera_local;
  KeypointTrackingLocalizer *this_local;
  
  local_18 = camera;
  camera_local = (SharedCameraModel *)this;
  Localizer::Localizer(&this->super_Localizer,camera);
  (this->super_Localizer).super_CameraUser._vptr_CameraUser =
       (_func_int **)&PTR__KeypointTrackingLocalizer_001819b0;
  cv::Mat::Mat(&this->mask);
  cv::Ptr<ary::Localization>::Ptr(&this->localization);
  cv::Ptr<ary::KeypointPlaneLocalizer>::Ptr(&this->localizer);
  std::
  vector<cv::Ptr<ary::TemplatePlaneVerifier>,_std::allocator<cv::Ptr<ary::TemplatePlaneVerifier>_>_>
  ::vector(&this->verifier);
  cv::Ptr<ary::PlaneTracker>::Ptr(&this->tracker);
  this->tracking_timeout = 0;
  this->tracking_select = -1;
  this_00 = (PlaneTracker *)operator_new(0x1c0);
  PlaneTracker::PlaneTracker(this_00,local_18);
  cv::Ptr<ary::PlaneTracker>::Ptr<ary::PlaneTracker>(&local_28,this_00);
  cv::Ptr<ary::PlaneTracker>::operator=(&this->tracker,&local_28);
  cv::Ptr<ary::PlaneTracker>::~Ptr(&local_28);
  return;
}

Assistant:

KeypointTrackingLocalizer::KeypointTrackingLocalizer(const SharedCameraModel& camera) : Localizer(camera), tracking_timeout(0), tracking_select(-1) {

#if CV_MAJOR_VERSION == 2
    localizer = Ptr<KeypointPlaneLocalizer>(new KeypointPlaneLocalizer(camera, ary::ORB));
#elif CV_MAJOR_VERSION == 3
    localizer = Ptr<KeypointPlaneLocalizer>(new KeypointPlaneLocalizer(camera, ary::AKAZE));
#endif

    tracker = Ptr<PlaneTracker>(new PlaneTracker(camera));
}